

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O3

void uv__fs_work(uv__work *w)

{
  _func_void_uv__work_ptr_int **buf;
  int iVar1;
  _func_void_uv__work_ptr_int *len;
  iovec *__iovec;
  uv__work *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  __mode_t __mode;
  int iVar6;
  uv_dirent_type_t uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint *puVar11;
  uv_loop_s *puVar12;
  long lVar13;
  ssize_t sVar14;
  size_t sVar15;
  dirent64 *dent;
  uv__queue *puVar16;
  uv__queue *puVar17;
  char *pcVar18;
  size_t sVar19;
  ssize_t sVar20;
  uint uVar21;
  long lVar22;
  uv__queue *puVar23;
  _func_void_uv__work_ptr *p_Var24;
  uv__work *__iovec_00;
  uv__queue **ppuVar25;
  uv__queue *puVar26;
  size_t sVar27;
  uint uVar28;
  uv__queue *puVar29;
  pollfd pfd;
  statfs s;
  _func_void_uv__work_ptr *local_21a0;
  stat64 local_2158;
  stat64 local_20c8;
  undefined1 local_2038 [24];
  uint local_2020;
  uint uStack_201c;
  __gid_t local_2018;
  int iStack_2014;
  uv__queue *local_2010;
  uv__queue *local_2008;
  __fsid_t _Stack_2000;
  _func_void_uv__work_ptr *local_1ff8;
  uv_fs_type local_1ff0;
  undefined4 uStack_1fec;
  uv_fs_cb local_1fe8;
  _func_void_uv__work_ptr *p_Stack_1fe0;
  void *local_1fd8;
  uv_loop_s *puStack_1fd0;
  undefined4 local_1fc8;
  char *local_1f28;
  int local_1f20;
  int local_1f1c;
  uv_buf_t *local_1f10;
  long local_1f08;
  uv__work local_1ee0;
  size_t local_1eb0;
  
  iVar1 = *(int *)&w[-7].done;
  puVar11 = (uint *)__errno_location();
  buf = &w[-6].done;
  do {
    *puVar11 = 0;
    switch(*(undefined4 *)&w[-7].done) {
    case 1:
      iVar6 = open64((char *)w[-6].work,*(uint *)((long)&w[-2].loop + 4) | 0x80000,
                     (ulong)*(uint *)&w[-2].wq.next);
      break;
    case 2:
      iVar6 = uv__close_nocancel(*(int *)&w[-2].loop);
      if (iVar6 == -1) {
        iVar6 = -(uint)(*puVar11 != 0x73 && *puVar11 != 4);
      }
      break;
    case 3:
      iVar6 = *(int *)&w[-2].loop;
      uVar28 = *(uint *)((long)&w[-2].wq.next + 4);
      p_Var24 = w[-1].work;
      __iovec = (iovec *)w[-2].wq.prev;
      uVar8 = uv__getiovmax();
      if (uVar28 < uVar8) {
        uVar8 = uVar28;
      }
      puVar29 = (uv__queue *)(ulong)uVar8;
      if ((long)p_Var24 < 0) {
        if (uVar8 != 0) {
          if (uVar8 == 1) {
            puVar29 = (uv__queue *)read(iVar6,__iovec->iov_base,__iovec->iov_len);
          }
          else {
            puVar29 = (uv__queue *)readv(iVar6,__iovec,uVar8);
          }
        }
      }
      else if (uVar8 != 0) {
        if (uVar8 == 1) {
          puVar29 = (uv__queue *)
                    pread64(iVar6,__iovec->iov_base,__iovec->iov_len,(__off64_t)p_Var24);
        }
        else {
          puVar29 = (uv__queue *)preadv64(iVar6,__iovec,uVar8,(__off64_t)p_Var24);
        }
      }
      if ((w[-7].loop != (uv_loop_s *)0x0) && (puVar2 = (uv__work *)w[-2].wq.prev, puVar2 != w + 1))
      {
        uv__free(puVar2);
      }
      w[-2].wq.prev = (uv__queue *)0x0;
      *(undefined4 *)((long)&w[-2].wq.next + 4) = 0;
      goto LAB_001e75b7;
    case 4:
      uVar8 = uv__getiovmax();
      uVar28 = *(uint *)((long)&w[-2].wq.next + 4);
      puVar2 = (uv__work *)w[-2].wq.prev;
      if (uVar28 == 0) {
        puVar29 = (uv__queue *)0x0;
      }
      else {
        puVar29 = (uv__queue *)0x0;
        __iovec_00 = puVar2;
        do {
          uVar21 = uVar8;
          if (uVar28 < uVar8) {
            uVar21 = uVar28;
          }
          *(uint *)((long)&w[-2].wq.next + 4) = uVar21;
          while( true ) {
            puVar17 = (uv__queue *)(ulong)uVar21;
            iVar6 = *(int *)&w[-2].loop;
            p_Var24 = w[-1].work;
            if ((long)p_Var24 < 0) {
              if (uVar21 == 1) {
                puVar17 = (uv__queue *)write(iVar6,__iovec_00->work,(size_t)__iovec_00->done);
              }
              else {
                if (uVar21 == 0) goto LAB_001e758e;
                puVar17 = (uv__queue *)writev(iVar6,(iovec *)__iovec_00,uVar21);
              }
            }
            else if (uVar21 == 1) {
              puVar17 = (uv__queue *)
                        pwrite64(iVar6,__iovec_00->work,(size_t)__iovec_00->done,(__off64_t)p_Var24)
              ;
            }
            else {
              if (uVar21 == 0) goto LAB_001e758e;
              puVar17 = (uv__queue *)pwritev64(iVar6,(iovec *)__iovec_00,uVar21,(__off64_t)p_Var24);
            }
            if (-1 < (long)puVar17) break;
            if (*puVar11 != 4) goto LAB_001e758e;
            uVar21 = *(uint *)((long)&w[-2].wq.next + 4);
            __iovec_00 = (uv__work *)w[-2].wq.prev;
          }
          if (puVar17 == (uv__queue *)0x0) {
            puVar17 = (uv__queue *)0x0;
LAB_001e758e:
            if (puVar29 == (uv__queue *)0x0) {
              puVar29 = puVar17;
            }
            break;
          }
          if (-1 < (long)w[-1].work) {
            w[-1].work = (_func_void_uv__work_ptr *)((long)&puVar17->next + (long)w[-1].work);
          }
          puVar23 = w[-2].wq.prev;
          ppuVar25 = &puVar23->prev;
          uVar21 = 0;
          puVar26 = puVar17;
          do {
            puVar16 = *ppuVar25;
            if (puVar26 <= puVar16 &&
                (uv__queue *)((long)puVar16 - (long)puVar26) != (uv__queue *)0x0) {
              ((uv__queue *)(ppuVar25 + -1))->next =
                   (uv__queue *)((long)&puVar26->next + (long)((uv__queue *)(ppuVar25 + -1))->next);
              *ppuVar25 = (uv__queue *)((long)puVar16 - (long)puVar26);
              puVar23 = w[-2].wq.prev;
              break;
            }
            uVar21 = uVar21 + 1;
            ppuVar25 = ppuVar25 + 2;
            puVar26 = (uv__queue *)((long)puVar26 - (long)puVar16);
          } while (puVar26 != (uv__queue *)0x0);
          *(uint *)((long)&w[-2].wq.next + 4) = uVar21;
          __iovec_00 = (uv__work *)(puVar23 + uVar21);
          w[-2].wq.prev = (uv__queue *)__iovec_00;
          puVar29 = (uv__queue *)((long)&puVar29->next + (long)puVar17);
          uVar28 = uVar28 - uVar21;
        } while (uVar28 != 0);
      }
      if (puVar2 != w + 1) {
        uv__free(puVar2);
      }
      w[-2].wq.prev = (uv__queue *)0x0;
      *(undefined4 *)((long)&w[-2].wq.next + 4) = 0;
      goto LAB_001e75b7;
    case 5:
      iVar6 = *(int *)&w[-2].loop;
      iVar10 = *(int *)((long)&w[-2].loop + 4);
      local_2158.st_dev = (__dev_t)w[-1].work;
      len = w[1].done;
      if (uv__fs_try_copy_file_range_no_copy_file_range_support != 0) goto LAB_001e67a3;
      sVar20 = uv__fs_copy_file_range(iVar10,(off_t *)&local_2158,iVar6,(off_t *)0x0,(size_t)len,0);
      if (sVar20 == -1) {
        uVar28 = *puVar11;
        if ((int)uVar28 < 0x12) {
          if (uVar28 == 1) {
            iVar9 = uv__is_cifs_or_smb(iVar6);
            if (iVar9 == 0) {
LAB_001e7823:
              uVar28 = *puVar11;
              goto LAB_001e782a;
            }
            goto LAB_001e67a3;
          }
          if (uVar28 == 0xd) {
            iVar9 = fstatfs64(iVar10,(statfs64 *)local_2038);
            if (((iVar9 == -1) || ((uv__queue *)local_2038._0_8_ != (uv__queue *)(data + 0x87a5a0)))
               || (uVar28 = uv__kernel_version(), 0x413ff < uVar28)) goto LAB_001e7823;
            goto LAB_001e67a3;
          }
LAB_001e782a:
          if (uVar28 == 0x26) goto LAB_001e67ae;
        }
        else {
          if (uVar28 != 0x12) {
            if (uVar28 == 0x26) {
              uv__fs_try_copy_file_range_no_copy_file_range_support = 1;
              goto LAB_001e7823;
            }
            if (uVar28 != 0x5f) goto LAB_001e782a;
          }
LAB_001e67a3:
          *puVar11 = 0x26;
LAB_001e67ae:
          sVar14 = sendfile64(iVar6,iVar10,(__off64_t *)&local_2158,(size_t)len);
          if (sVar14 != -1) goto LAB_001e741d;
        }
        if ((long)local_2158.st_dev <= (long)w[-1].work) {
          uVar28 = *puVar11;
          if (((uVar28 < 0x17) && ((0x440020U >> (uVar28 & 0x1f) & 1) != 0)) ||
             (puVar29 = (uv__queue *)0xffffffffffffffff, uVar28 == 0x58)) {
            *puVar11 = 0;
            puVar29 = (uv__queue *)w[1].done;
            local_21a0 = w[-1].work;
            if (puVar29 != (uv__queue *)0x0) {
              iVar6 = *(int *)&w[-2].loop;
              iVar10 = *(int *)((long)&w[-2].loop + 4);
              bVar5 = true;
              puVar17 = (uv__queue *)0x0;
LAB_001e683b:
              do {
                sVar19 = (long)puVar29 - (long)puVar17;
                if (0x1fff < sVar19) {
                  sVar19 = 0x2000;
                }
LAB_001e684f:
                if (bVar5) {
                  sVar15 = pread64(iVar10,local_2038,sVar19,(__off64_t)local_21a0);
                }
                else {
                  sVar15 = read(iVar10,local_2038,sVar19);
                }
                if (sVar15 == 0xffffffffffffffff) goto code_r0x001e687b;
                if (sVar15 == 0) goto LAB_001e77b2;
                if (0 < (long)sVar15) {
                  lVar22 = 0;
                  sVar19 = sVar15;
                  do {
                    while (sVar14 = write(iVar6,local_2038 + lVar22,sVar19), sVar14 == -1) {
                      if (*puVar11 != 4) {
                        if (*puVar11 != 0xb) goto LAB_001e757e;
                        local_20c8.st_dev._4_2_ = 4;
                        local_20c8.st_dev._6_2_ = 0;
                        local_20c8.st_dev._0_4_ = iVar6;
                        while (iVar9 = poll((pollfd *)&local_20c8,1,-1), iVar9 == -1) {
                          if (*puVar11 != 4) goto LAB_001e77f7;
                        }
                        if ((local_20c8.st_dev._6_2_ & 0xfffb) != 0) {
LAB_001e77f7:
                          *puVar11 = 5;
                          goto LAB_001e757e;
                        }
                      }
                    }
                    lVar22 = lVar22 + sVar14;
                    sVar19 = sVar15 - lVar22;
                  } while (sVar19 != 0 && lVar22 <= (long)sVar15);
                }
                local_21a0 = local_21a0 + sVar15;
                puVar17 = (uv__queue *)((long)&puVar17->next + sVar15);
                if (puVar29 <= puVar17) {
LAB_001e77b2:
                  if (puVar17 != (uv__queue *)0xffffffffffffffff) goto LAB_001e77c0;
                  puVar29 = (uv__queue *)0xffffffffffffffff;
                  goto LAB_001e75b7;
                }
              } while( true );
            }
            puVar17 = (uv__queue *)0x0;
LAB_001e77c0:
            w[-1].work = local_21a0;
            puVar29 = puVar17;
          }
          goto LAB_001e75b7;
        }
      }
LAB_001e741d:
      puVar29 = (uv__queue *)(local_2158.st_dev + -(long)w[-1].work);
      w[-1].work = (_func_void_uv__work_ptr *)local_2158.st_dev;
      goto LAB_001e75b7;
    case 6:
      p_Var24 = w[-6].work;
      iVar6 = uv__fs_statx(-1,(char *)p_Var24,0,0,(uv_stat_t *)buf);
      if (iVar6 == -0x26) {
        iVar6 = stat64((char *)p_Var24,(stat64 *)local_2038);
LAB_001e702a:
        if (iVar6 == 0) {
          w[-6].done = (_func_void_uv__work_ptr_int *)local_2038._0_8_;
          w[-6].loop = (uv_loop_s *)(ulong)local_2020;
          w[-6].wq.next = (uv__queue *)local_2038._16_8_;
          auVar4._4_4_ = 0;
          auVar4._0_4_ = uStack_201c;
          auVar4._8_4_ = local_2018;
          auVar4._12_4_ = 0;
          *(undefined1 (*) [16])&w[-6].wq.prev = auVar4;
          w[-5].done = (_func_void_uv__work_ptr_int *)local_2010;
          w[-5].loop = (uv_loop_s *)local_2038._8_8_;
          w[-5].wq.next = local_2008;
          w[-5].wq.prev = (uv__queue *)_Stack_2000.__val;
          w[-4].work = local_1ff8;
          w[-4].wq.next = (uv__queue *)CONCAT44(uStack_1fec,local_1ff0);
          *(undefined4 *)&w[-4].wq.prev = local_1fe8._0_4_;
          w[-3].work = p_Stack_1fe0;
          *(undefined4 *)&w[-3].done = local_1fd8._0_4_;
          w[-3].loop = puStack_1fd0;
          *(undefined4 *)&w[-3].wq.next = local_1fc8;
          w[-3].wq.prev = (uv__queue *)puStack_1fd0;
          *(undefined4 *)&w[-2].work = local_1fc8;
          w[-4].done = (_func_void_uv__work_ptr_int *)0x0;
          w[-4].loop = (uv_loop_s *)0x0;
          iVar6 = 0;
        }
      }
      break;
    case 7:
      p_Var24 = w[-6].work;
      iVar6 = uv__fs_statx(-1,(char *)p_Var24,0,1,(uv_stat_t *)buf);
      if (iVar6 == -0x26) {
        iVar6 = lstat64((char *)p_Var24,(stat64 *)local_2038);
        goto LAB_001e702a;
      }
      break;
    case 8:
      iVar10 = *(int *)&w[-2].loop;
      iVar6 = uv__fs_statx(iVar10,"",1,0,(uv_stat_t *)buf);
      if ((iVar6 == -0x26) && (iVar6 = fstat64(iVar10,(stat64 *)local_2038), iVar6 == 0)) {
        w[-6].done = (_func_void_uv__work_ptr_int *)local_2038._0_8_;
        w[-6].loop = (uv_loop_s *)(ulong)local_2020;
        w[-6].wq.next = (uv__queue *)local_2038._16_8_;
        auVar3._4_4_ = 0;
        auVar3._0_4_ = uStack_201c;
        auVar3._8_4_ = local_2018;
        auVar3._12_4_ = 0;
        *(undefined1 (*) [16])&w[-6].wq.prev = auVar3;
        w[-5].done = (_func_void_uv__work_ptr_int *)local_2010;
        w[-5].loop = (uv_loop_s *)local_2038._8_8_;
        w[-5].wq.next = local_2008;
        w[-5].wq.prev = (uv__queue *)_Stack_2000.__val;
        w[-4].work = local_1ff8;
        w[-4].wq.next = (uv__queue *)CONCAT44(uStack_1fec,local_1ff0);
        *(undefined4 *)&w[-4].wq.prev = local_1fe8._0_4_;
        w[-3].work = p_Stack_1fe0;
        *(undefined4 *)&w[-3].done = local_1fd8._0_4_;
        w[-3].loop = puStack_1fd0;
        *(undefined4 *)&w[-3].wq.next = local_1fc8;
        w[-3].wq.prev = (uv__queue *)puStack_1fd0;
        *(undefined4 *)&w[-2].work = local_1fc8;
        w[-4].done = (_func_void_uv__work_ptr_int *)0x0;
        w[-4].loop = (uv_loop_s *)0x0;
        iVar6 = 0;
      }
      break;
    case 9:
      iVar6 = ftruncate64(*(int *)&w[-2].loop,(__off64_t)w[-1].work);
      break;
    case 10:
      puVar29 = w[-1].wq.next;
      lVar22 = (long)(double)puVar29;
      puVar12 = (uv_loop_s *)
                (((long)(((double)puVar29 - (double)lVar22) * 1000000000.0) / 1000) * 1000);
      local_2038._0_8_ = ((long)puVar12 >> 0x3f) + lVar22;
      local_2038._8_8_ = (uv_loop_s *)(long)((double)(long)puVar12 + 1000000000.0);
      if (-1 < (long)puVar12) {
        local_2038._8_8_ = puVar12;
      }
      puVar29 = w[-1].wq.prev;
      lVar22 = (long)(double)puVar29;
      lVar13 = ((long)(((double)puVar29 - (double)lVar22) * 1000000000.0) / 1000) * 1000;
      local_2038._16_8_ = (lVar13 >> 0x3f) + lVar22;
      lVar22 = (long)((double)lVar13 + 1000000000.0);
      if (-1 < lVar13) {
        lVar22 = lVar13;
      }
      local_2020 = (uint)lVar22;
      uStack_201c = (uint)((ulong)lVar22 >> 0x20);
      p_Var24 = w[-6].work;
      iVar6 = 0;
      goto LAB_001e6a99;
    case 0xb:
      puVar29 = w[-1].wq.next;
      lVar22 = (long)(double)puVar29;
      puVar12 = (uv_loop_s *)
                (((long)(((double)puVar29 - (double)lVar22) * 1000000000.0) / 1000) * 1000);
      local_2038._0_8_ = ((long)puVar12 >> 0x3f) + lVar22;
      local_2038._8_8_ = (uv_loop_s *)(long)((double)(long)puVar12 + 1000000000.0);
      if (-1 < (long)puVar12) {
        local_2038._8_8_ = puVar12;
      }
      puVar29 = w[-1].wq.prev;
      lVar22 = (long)(double)puVar29;
      lVar13 = ((long)(((double)puVar29 - (double)lVar22) * 1000000000.0) / 1000) * 1000;
      local_2038._16_8_ = (lVar13 >> 0x3f) + lVar22;
      lVar22 = (long)((double)lVar13 + 1000000000.0);
      if (-1 < lVar13) {
        lVar22 = lVar13;
      }
      local_2020 = (uint)lVar22;
      uStack_201c = (uint)((ulong)lVar22 >> 0x20);
      iVar6 = futimens(*(int *)&w[-2].loop,(timespec *)local_2038);
      break;
    case 0xc:
      iVar6 = access((char *)w[-6].work,*(int *)((long)&w[-2].loop + 4));
      break;
    case 0xd:
      iVar6 = chmod((char *)w[-6].work,*(__mode_t *)&w[-2].wq.next);
      break;
    case 0xe:
      iVar6 = fchmod(*(int *)&w[-2].loop,*(__mode_t *)&w[-2].wq.next);
      break;
    case 0xf:
      iVar6 = fsync(*(int *)&w[-2].loop);
      break;
    case 0x10:
      iVar6 = fdatasync(*(int *)&w[-2].loop);
      break;
    case 0x11:
      iVar6 = unlink((char *)w[-6].work);
      break;
    case 0x12:
      iVar6 = rmdir((char *)w[-6].work);
      break;
    case 0x13:
      iVar6 = mkdir((char *)w[-6].work,*(__mode_t *)&w[-2].wq.next);
      break;
    case 0x14:
      pcVar18 = mkdtemp((char *)w[-6].work);
      puVar29 = (uv__queue *)-(ulong)(pcVar18 == (char *)0x0);
      goto LAB_001e75b7;
    case 0x15:
      iVar6 = rename((char *)w[-6].work,(char *)w[-2].done);
      break;
    case 0x16:
      local_2038._0_8_ = (uv__queue *)0x0;
      iVar6 = scandir64((char *)w[-6].work,(dirent64 ***)local_2038,uv__fs_scandir_filter,
                        uv__fs_scandir_sort);
      *(undefined4 *)((long)&w[-2].wq.next + 4) = 0;
      if (iVar6 != -1) {
        puVar29 = (uv__queue *)local_2038._0_8_;
        if (iVar6 == 0) {
          free((void *)local_2038._0_8_);
          puVar29 = (uv__queue *)0x0;
        }
        w[-7].wq.prev = puVar29;
        goto LAB_001e748b;
      }
LAB_001e757e:
      puVar29 = (uv__queue *)0xffffffffffffffff;
      goto LAB_001e75b7;
    case 0x17:
      iVar6 = link((char *)w[-6].work,(char *)w[-2].done);
      break;
    case 0x18:
      iVar6 = symlink((char *)w[-6].work,(char *)w[-2].done);
      break;
    case 0x19:
      sVar15 = pathconf((char *)w[-6].work,4);
      sVar19 = 0x1000;
      if (sVar15 != 0xffffffffffffffff) {
        sVar19 = sVar15;
      }
      puVar29 = (uv__queue *)uv__malloc(sVar19);
      if (puVar29 == (uv__queue *)0x0) {
        *puVar11 = 0xc;
      }
      else {
        sVar15 = readlink((char *)w[-6].work,(char *)puVar29,sVar19);
        if (sVar15 == 0xffffffffffffffff) {
          uv__free(puVar29);
        }
        else if ((sVar15 != sVar19) ||
                (puVar29 = (uv__queue *)uv__reallocf(puVar29,sVar19 + 1), sVar15 = sVar19,
                puVar29 != (uv__queue *)0x0)) {
          *(char *)((long)&puVar29->next + sVar15) = '\0';
          goto LAB_001e7a71;
        }
      }
      goto LAB_001e75c1;
    case 0x1a:
      iVar6 = chown((char *)w[-6].work,*(__uid_t *)&w[-1].done,*(__gid_t *)((long)&w[-1].done + 4));
      break;
    case 0x1b:
      iVar6 = fchown(*(int *)&w[-2].loop,*(__uid_t *)&w[-1].done,*(__gid_t *)((long)&w[-1].done + 4)
                    );
      break;
    case 0x1c:
      iVar6 = lchown((char *)w[-6].work,*(__uid_t *)&w[-1].done,*(__gid_t *)((long)&w[-1].done + 4))
      ;
      break;
    case 0x1d:
      puVar29 = (uv__queue *)realpath((char *)w[-6].work,(char *)0x0);
      if (puVar29 != (uv__queue *)0x0) goto LAB_001e7a71;
      goto LAB_001e75c1;
    case 0x1e:
      iVar6 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-6].work,0,0,(uv_fs_cb)0x0
                        );
      uv_fs_req_cleanup((uv_fs_t *)local_2038);
      p_Var24 = p_Stack_1fe0;
      if (-1 < iVar6) {
        iVar6 = (int)p_Stack_1fe0;
        iVar10 = fstat64((int)p_Stack_1fe0,&local_20c8);
        __mode = local_20c8.st_mode;
        if (iVar10 == 0) {
          uVar28 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].done,
                              (*(uint *)((long)&w[-2].loop + 4) & 1) << 7 | 0x41,local_20c8.st_mode,
                              (uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)local_2038);
          if (-1 < (int)uVar28) {
            iVar10 = (int)p_Stack_1fe0;
            if (((ulong)w[-2].loop & 0x100000000) == 0) {
              iVar9 = fstat64((int)p_Stack_1fe0,&local_2158);
              if (iVar9 == 0) {
                if (((_func_void_uv__work_ptr *)
                     CONCAT26(local_20c8.st_dev._6_2_,
                              CONCAT24(local_20c8.st_dev._4_2_,(int)local_20c8.st_dev)) ==
                     (_func_void_uv__work_ptr *)local_2158.st_dev) &&
                   (local_20c8.st_ino == local_2158.st_ino)) {
                  uVar28 = 0;
                  goto LAB_001e731e;
                }
                iVar9 = ftruncate64(iVar10,0);
                if ((iVar9 == 0) ||
                   ((uVar8 = -*puVar11, *puVar11 == 0xd && (uVar28 = 0, local_2158.st_size < 1))))
                goto LAB_001e786f;
              }
              else {
                uVar8 = -*puVar11;
              }
            }
            else {
LAB_001e786f:
              uVar8 = uVar28;
              iVar9 = fchmod(iVar10,__mode);
              if (iVar9 == -1) {
                if (*puVar11 != 1) {
                  uVar8 = -*puVar11;
                  goto LAB_001e7314;
                }
                iVar9 = uv__is_cifs_or_smb(iVar10);
                uVar8 = 0;
                if (iVar9 == 0) {
                  uVar28 = 0xffffffff;
                  goto LAB_001e731e;
                }
              }
              if (((ulong)w[-2].loop & 0x600000000) != 0) {
                uVar28 = 0;
                iVar9 = ioctl(iVar10,0x40049409,(ulong)p_Var24 & 0xffffffff);
                if (iVar9 == 0) goto LAB_001e731e;
                if (((ulong)w[-2].loop & 0x400000000) != 0) {
                  uVar8 = -*puVar11;
                  goto LAB_001e7314;
                }
              }
              if (local_20c8.st_size != 0) {
                lVar22 = 0;
                sVar27 = local_20c8.st_size;
                do {
                  local_2038._8_8_ = (uv_loop_s *)0x0;
                  local_2038._16_4_ = 6;
                  local_1ff0 = UV_FS_SENDFILE;
                  local_1f28 = (char *)0x0;
                  local_1f10 = (uv_buf_t *)0x0;
                  local_1fd8 = (void *)0x0;
                  puStack_1fd0 = (uv_loop_s *)0x0;
                  local_1fe8 = (uv_fs_cb)0x0;
                  p_Stack_1fe0 = (_func_void_uv__work_ptr *)0x0;
                  local_1f1c = iVar6;
                  local_1f20 = iVar10;
                  local_1f08 = lVar22;
                  local_1eb0 = sVar27;
                  uv__fs_work((uv__work *)(local_2038 + 0x158));
                  p_Var24 = p_Stack_1fe0;
                  uv_fs_req_cleanup((uv_fs_t *)local_2038);
                  if ((long)p_Var24 < 0) {
                    uVar8 = (uint)p_Var24;
                    break;
                  }
                  lVar22 = lVar22 + (long)p_Var24;
                  sVar27 = sVar27 - (long)p_Var24;
                } while (sVar27 != 0);
              }
            }
            goto LAB_001e7314;
          }
          iVar10 = -1;
        }
        else {
          uVar8 = -*puVar11;
          iVar10 = -1;
LAB_001e7314:
          uVar28 = (int)uVar8 >> 0x1f & uVar8;
        }
LAB_001e731e:
        uVar8 = uv__close_nocheckstdio(iVar6);
        if (uVar8 == 0) {
          uVar8 = uVar28;
        }
        if (uVar28 != 0) {
          uVar8 = uVar28;
        }
        if (iVar10 < 0) {
          if (uVar8 == 0) goto LAB_001e7587;
        }
        else {
          uVar28 = uv__close_nocheckstdio(iVar10);
          if (uVar28 == 0) {
            uVar28 = uVar8;
          }
          if (uVar8 == 0) {
            uVar8 = uVar28;
          }
          if (uVar8 == 0) {
LAB_001e7587:
            puVar29 = (uv__queue *)0x0;
            goto LAB_001e75b7;
          }
          uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)local_2038,(char *)w[-2].done,(uv_fs_cb)0x0);
          uv_fs_req_cleanup((uv_fs_t *)local_2038);
        }
        *puVar11 = -uVar8;
        goto LAB_001e757e;
      }
      goto LAB_001e748b;
    case 0x1f:
      puVar17 = (uv__queue *)uv__malloc(0x38);
      if (puVar17 == (uv__queue *)0x0) {
LAB_001e73de:
        uv__free(puVar17);
        puVar29 = (uv__queue *)0xffffffffffffffff;
        puVar17 = (uv__queue *)0x0;
      }
      else {
        puVar29 = (uv__queue *)opendir((char *)w[-6].work);
        puVar17[3].next = puVar29;
        if (puVar29 == (uv__queue *)0x0) goto LAB_001e73de;
        puVar29 = (uv__queue *)0x0;
      }
      w[-7].wq.prev = puVar17;
      goto LAB_001e75b7;
    case 0x20:
      puVar29 = w[-7].wq.prev;
      if (puVar29->prev != (uv__queue *)0x0) {
        puVar23 = (uv__queue *)0x0;
        puVar17 = (uv__queue *)0x0;
LAB_001e6e02:
        do {
          *puVar11 = 0;
          dent = readdir64((DIR *)puVar29[3].next);
          uVar28 = (uint)puVar17;
          if (dent == (dirent64 *)0x0) {
            if (*puVar11 != 0) {
LAB_001e749d:
              if (uVar28 != 0) {
                lVar22 = 0;
                do {
                  uv__free(*(void **)((long)&puVar29->next->next + lVar22));
                  *(undefined8 *)((long)&puVar29->next->next + lVar22) = 0;
                  lVar22 = lVar22 + 0x10;
                } while ((long)puVar17 << 4 != lVar22);
              }
              uVar28 = 0xffffffff;
            }
            break;
          }
          if ((dent->d_name[0] == '.') &&
             ((dent->d_name[1] == '\0' || ((dent->d_name[1] == '.' && (dent->d_name[2] == '\0'))))))
          goto LAB_001e6e3e;
          puVar26 = puVar29->next;
          puVar16 = (uv__queue *)uv__strdup(dent->d_name);
          puVar26[(long)puVar23].next = puVar16;
          if (puVar16 == (uv__queue *)0x0) goto LAB_001e749d;
          uVar7 = uv__fs_get_dirent_type((uv__dirent_t *)dent);
          *(uv_dirent_type_t *)&puVar26[(long)puVar23].prev = uVar7;
          uVar28 = uVar28 + 1;
          puVar23 = (uv__queue *)(ulong)uVar28;
          puVar17 = puVar23;
        } while (puVar23 < puVar29->prev);
        goto LAB_001e74d9;
      }
      uVar28 = 0;
LAB_001e74d9:
      puVar29 = (uv__queue *)(long)(int)uVar28;
      goto LAB_001e75b7;
    case 0x21:
      puVar29 = w[-7].wq.prev;
      if (puVar29[3].next != (uv__queue *)0x0) {
        closedir((DIR *)puVar29[3].next);
        puVar29[3].next = (uv__queue *)0x0;
        puVar29 = w[-7].wq.prev;
      }
      uv__free(puVar29);
      puVar29 = (uv__queue *)0x0;
LAB_001e7a71:
      w[-7].wq.prev = puVar29;
      w[-7].wq.next = (uv__queue *)0x0;
      goto LAB_001e7a07;
    case 0x22:
      iVar6 = statfs64((char *)w[-6].work,(statfs64 *)local_2038);
      puVar29 = (uv__queue *)0xffffffffffffffff;
      if (iVar6 == 0) {
        puVar17 = (uv__queue *)uv__malloc(0x58);
        if (puVar17 == (uv__queue *)0x0) {
          *puVar11 = 0xc;
        }
        else {
          puVar17->next = (uv__queue *)local_2038._0_8_;
          puVar17->prev = (uv__queue *)local_2038._8_8_;
          puVar17[1].next = (uv__queue *)local_2038._16_8_;
          puVar17[1].prev = (uv__queue *)CONCAT44(uStack_201c,local_2020);
          puVar17[2].next = (uv__queue *)CONCAT44(iStack_2014,local_2018);
          puVar17[2].prev = local_2010;
          puVar17[3].next = local_2008;
          w[-7].wq.prev = puVar17;
          puVar29 = (uv__queue *)0x0;
        }
      }
      goto LAB_001e75b7;
    case 0x23:
      p_Var24 = w[-6].work;
      sVar19 = strlen((char *)p_Var24);
      if ((sVar19 < 6) || (iVar6 = strcmp((char *)(p_Var24 + (sVar19 - 6)),"XXXXXX"), iVar6 != 0)) {
        *puVar11 = 0x16;
        iVar6 = -1;
      }
      else {
        uv_once(&uv__fs_mkstemp_once,uv__mkostemp_initonce);
        if (uv__mkostemp != (_func_int_char_ptr_int *)0x0 && uv__fs_mkstemp_no_cloexec_support == 0)
        {
          iVar6 = (*uv__mkostemp)((char *)p_Var24,0x80000);
          if (-1 < iVar6) goto LAB_001e748b;
          if (*puVar11 != 0x16) goto LAB_001e73be;
          uv__fs_mkstemp_no_cloexec_support = 1;
        }
        if (w[-7].loop != (uv_loop_s *)0x0) {
          uv_rwlock_rdlock((uv_rwlock_t *)(w[-9].wq.next + 0x13));
        }
        iVar6 = mkstemp64((char *)p_Var24);
        if ((-1 < iVar6) && (iVar10 = uv__cloexec(iVar6,1), iVar10 != 0)) {
          iVar10 = uv__close(iVar6);
          iVar6 = -1;
          if (iVar10 != 0) {
switchD_001e6627_default:
            abort();
          }
        }
        if (w[-7].loop != (uv_loop_s *)0x0) {
          uv_rwlock_rdunlock((uv_rwlock_t *)(w[-9].wq.next + 0x13));
        }
        if (-1 < iVar6) goto LAB_001e748b;
      }
LAB_001e73be:
      *p_Var24 = (_func_void_uv__work_ptr)0x0;
LAB_001e748b:
      puVar29 = (uv__queue *)(long)iVar6;
      goto LAB_001e75b7;
    case 0x24:
      puVar29 = w[-1].wq.next;
      lVar22 = (long)(double)puVar29;
      puVar12 = (uv_loop_s *)
                (((long)(((double)puVar29 - (double)lVar22) * 1000000000.0) / 1000) * 1000);
      local_2038._0_8_ = ((long)puVar12 >> 0x3f) + lVar22;
      local_2038._8_8_ = (uv_loop_s *)(long)((double)(long)puVar12 + 1000000000.0);
      if (-1 < (long)puVar12) {
        local_2038._8_8_ = puVar12;
      }
      puVar29 = w[-1].wq.prev;
      lVar22 = (long)(double)puVar29;
      lVar13 = ((long)(((double)puVar29 - (double)lVar22) * 1000000000.0) / 1000) * 1000;
      local_2038._16_8_ = (lVar13 >> 0x3f) + lVar22;
      lVar22 = (long)((double)lVar13 + 1000000000.0);
      if (-1 < lVar13) {
        lVar22 = lVar13;
      }
      local_2020 = (uint)lVar22;
      uStack_201c = (uint)((ulong)lVar22 >> 0x20);
      p_Var24 = w[-6].work;
      iVar6 = 0x100;
LAB_001e6a99:
      iVar6 = utimensat(-100,(char *)p_Var24,(timespec *)local_2038,iVar6);
      break;
    default:
      goto switchD_001e6627_default;
    }
    puVar29 = (uv__queue *)(long)iVar6;
LAB_001e75b7:
    if (puVar29 != (uv__queue *)0xffffffffffffffff) {
      w[-7].wq.next = puVar29;
      if (puVar29 != (uv__queue *)0x0) {
        return;
      }
LAB_001e7a07:
      if (2 < *(int *)&w[-7].done - 6U) {
        return;
      }
      w[-7].wq.prev = (uv__queue *)buf;
      return;
    }
LAB_001e75c1:
    if ((0xfffffffd < iVar1 - 4U) || (*puVar11 != 4)) {
      w[-7].wq.next = (uv__queue *)-(long)(int)*puVar11;
      return;
    }
  } while( true );
LAB_001e6e3e:
  if (puVar29->prev <= puVar23) goto LAB_001e74d9;
  goto LAB_001e6e02;
code_r0x001e687b:
  uVar28 = *puVar11;
  if (uVar28 != 4) goto code_r0x001e6887;
  goto LAB_001e684f;
code_r0x001e6887:
  if ((!bVar5) || (puVar17 != (uv__queue *)0x0)) {
    puVar29 = (uv__queue *)0xffffffffffffffff;
    if ((code *)((long)&puVar17->next + 1U) < (code *)0x2) goto LAB_001e75b7;
    goto LAB_001e77c0;
  }
  bVar5 = false;
  puVar17 = (uv__queue *)0x0;
  if ((uVar28 == 5) || (puVar17 = (uv__queue *)0x0, uVar28 == 0x1d)) goto LAB_001e683b;
  goto LAB_001e757e;
}

Assistant:

static void uv__fs_work(struct uv__work* w) {
  int retry_on_eintr;
  uv_fs_t* req;
  ssize_t r;

  req = container_of(w, uv_fs_t, work_req);
  retry_on_eintr = !(req->fs_type == UV_FS_CLOSE ||
                     req->fs_type == UV_FS_READ);

  do {
    errno = 0;

#define X(type, action)                                                       \
  case UV_FS_ ## type:                                                        \
    r = action;                                                               \
    break;

    switch (req->fs_type) {
    X(ACCESS, access(req->path, req->flags));
    X(CHMOD, chmod(req->path, req->mode));
    X(CHOWN, chown(req->path, req->uid, req->gid));
    X(CLOSE, uv__fs_close(req->file));
    X(COPYFILE, uv__fs_copyfile(req));
    X(FCHMOD, fchmod(req->file, req->mode));
    X(FCHOWN, fchown(req->file, req->uid, req->gid));
    X(LCHOWN, lchown(req->path, req->uid, req->gid));
    X(FDATASYNC, uv__fs_fdatasync(req));
    X(FSTAT, uv__fs_fstat(req->file, &req->statbuf));
    X(FSYNC, uv__fs_fsync(req));
    X(FTRUNCATE, ftruncate(req->file, req->off));
    X(FUTIME, uv__fs_futime(req));
    X(LUTIME, uv__fs_lutime(req));
    X(LSTAT, uv__fs_lstat(req->path, &req->statbuf));
    X(LINK, link(req->path, req->new_path));
    X(MKDIR, mkdir(req->path, req->mode));
    X(MKDTEMP, uv__fs_mkdtemp(req));
    X(MKSTEMP, uv__fs_mkstemp(req));
    X(OPEN, uv__fs_open(req));
    X(READ, uv__fs_read(req));
    X(SCANDIR, uv__fs_scandir(req));
    X(OPENDIR, uv__fs_opendir(req));
    X(READDIR, uv__fs_readdir(req));
    X(CLOSEDIR, uv__fs_closedir(req));
    X(READLINK, uv__fs_readlink(req));
    X(REALPATH, uv__fs_realpath(req));
    X(RENAME, rename(req->path, req->new_path));
    X(RMDIR, rmdir(req->path));
    X(SENDFILE, uv__fs_sendfile(req));
    X(STAT, uv__fs_stat(req->path, &req->statbuf));
    X(STATFS, uv__fs_statfs(req));
    X(SYMLINK, symlink(req->path, req->new_path));
    X(UNLINK, unlink(req->path));
    X(UTIME, uv__fs_utime(req));
    X(WRITE, uv__fs_write_all(req));
    default: abort();
    }
#undef X
  } while (r == -1 && errno == EINTR && retry_on_eintr);

  if (r == -1)
    req->result = UV__ERR(errno);
  else
    req->result = r;

  if (r == 0 && (req->fs_type == UV_FS_STAT ||
                 req->fs_type == UV_FS_FSTAT ||
                 req->fs_type == UV_FS_LSTAT)) {
    req->ptr = &req->statbuf;
  }
}